

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O2

MPP_RET hal_h265e_v580_start(void *hal,HalEncTask *enc_task)

{
  hevc_vepu580_base *regs;
  MppBuffer *buffer;
  undefined8 uVar1;
  long lVar2;
  H265eSyntax_new *syn;
  MppDevRegOffCfgs *pMVar3;
  MppDev ctx;
  MppFrameFormat MVar4;
  RK_U32 RVar5;
  MPP_RET MVar6;
  int iVar7;
  void *__dest;
  void *pvVar8;
  size_t sVar9;
  uint uVar10;
  int tile_start_x;
  ulong uVar11;
  long lVar12;
  RK_U16 RVar13;
  uint uVar14;
  char *fmt;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  MppBuffer *ppvVar20;
  ulong uVar21;
  uint uVar22;
  RK_U32 offset;
  bool bVar23;
  MppDevRegWrCfg cfg;
  int local_9c;
  void *local_70;
  undefined8 local_68;
  MppBuffer *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uint *local_38;
  
  lVar2 = *(long *)((long)hal + 0x80);
  syn = *(H265eSyntax_new **)((long)hal + 0xd0);
  uVar15 = ((syn->pp).num_tile_rows_minus1 + 1) * ((syn->pp).num_tile_columns_minus1 + 1);
  local_38 = *(uint **)((long)hal + 0x110);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xb46);
  }
  *(uint *)((long)hal + 0xe8) = uVar15;
  if ((enc_task->flags).err == 0) {
    if (uVar15 < 5) {
      local_58 = lVar2 + 0x1b0;
      local_60 = &enc_task->output;
      buffer = (MppBuffer *)((long)hal + 0xf8);
      local_50 = (ulong)(uVar15 - 1);
      local_40 = (ulong)uVar15;
      uVar21 = 0;
      local_9c = 0;
      tile_start_x = 0;
      local_48 = (ulong)uVar15;
      do {
        if (uVar21 == local_40) {
          MVar6 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
          if (MVar6 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","send cmd failed %d\n","hal_h265e_v580_start",
                       (ulong)(uint)MVar6);
          }
          if (((byte)hal_h265e_debug & 4) == 0) {
            return MVar6;
          }
          _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xbb9);
          return MVar6;
        }
        __dest = *(void **)(lVar2 + 0x18 + uVar21 * 8);
        pvVar8 = *(void **)(lVar2 + 0x38 + uVar21 * 8);
        if (__dest == (void *)0x0) {
          __dest = mpp_osal_malloc("hal_h265e_v580_start",0x1d08);
          *(void **)(lVar2 + 0x18 + uVar21 * 8) = __dest;
        }
        if (pvVar8 == (void *)0x0) {
          pvVar8 = mpp_osal_malloc("hal_h265e_v580_start",0x2d4);
          *(void **)(lVar2 + 0x38 + uVar21 * 8) = pvVar8;
        }
        if (uVar21 != 0) {
          memcpy(__dest,*(void **)(lVar2 + 0x18),0x1d08);
        }
        uVar22 = *(uint *)((long)__dest + 0x160);
        uVar15 = *(uint *)((long)__dest + 0x150) * 4;
        uVar16 = uVar15 & 0x3c;
        uVar10 = uVar22 & 0x1fff;
        uVar14 = (*(uint *)((long)__dest + 0xf0) & 0x7ff) * 8 + 0x47 >> 6;
        if (((uint)(syn->pp).field_22 & 0x80) == 0) {
          uVar10 = uVar10 - uVar16;
          uVar17 = uVar10 >> 4;
          if ((int)uVar10 < 0) {
            uVar17 = -(0xf - uVar10 >> 4);
          }
          uVar14 = uVar14 - 1;
          uVar18 = uVar14;
          if ((int)uVar17 < (int)uVar14) {
            uVar18 = uVar17;
          }
          if ((int)uVar17 < 0) {
            uVar18 = 0;
          }
        }
        else {
          uVar18 = uVar10 - uVar16;
          uVar17 = uVar18 >> 4;
          if ((int)uVar18 < 0) {
            uVar17 = -(0xf - uVar18 >> 4);
          }
          uVar17 = uVar17 + tile_start_x;
          uVar14 = uVar14 - 1;
          uVar18 = uVar14;
          if ((int)uVar17 < (int)uVar14) {
            uVar18 = uVar17;
          }
          if ((int)uVar17 < 0) {
            uVar18 = 0;
          }
          uVar10 = (uVar10 + uVar16 + 0xf >> 4) + tile_start_x +
                   (syn->pp).column_width_minus1[uVar21];
          if ((int)uVar10 < (int)uVar14) {
            uVar14 = uVar10;
          }
          if ((int)uVar10 < 0) {
            uVar14 = 0;
          }
        }
        uVar14 = (uVar14 - uVar18) * 0x40 + 0x40;
        uVar11 = (ulong)((uVar14 & 0x7fc0) << 0xc);
        if (uVar14 == 0) {
          uVar11 = 0x40000;
        }
        uVar15 = (uVar22 & 0xf) - (uVar15 & 0xc);
        uVar18 = (uVar15 >> 0x1b & 0xfffffff0) + uVar15 + uVar16 * 2 + 0xf >> 4;
        uVar17 = uVar22 >> 0x10 & 3;
        uVar10 = *(uint *)((long)__dest + 0x150) >> 1 & 0x78;
        uVar16 = uVar17 + uVar10 + 3 >> 2;
        uVar15 = uVar16 + 4;
        uVar22 = (uint)(uVar11 >> 0x12);
        uVar14 = uVar18 + 1;
        if (uVar22 <= uVar18) {
          uVar14 = uVar22;
        }
        regs = (hevc_vepu580_base *)((long)__dest + 0x60);
        iVar7 = (int)(uVar11 >> 0x10);
        uVar18 = 4;
        for (iVar19 = 0;
            (uVar18 < (uVar16 + 7 & 0xfffffffc) && (uVar14 * 4 * uVar15 + iVar19 < 0x9a0));
            iVar19 = iVar19 + iVar7 * 4) {
          uVar18 = uVar18 + 4;
          bVar23 = uVar15 < 9;
          uVar15 = uVar15 - 4;
          if (bVar23) {
            uVar15 = 4;
          }
        }
        iVar19 = uVar15 << 2;
        if (uVar17 == 0 && uVar10 == 0) {
          iVar19 = 0;
          uVar18 = uVar18 + 4;
        }
        if (0x9a0 < iVar19 * uVar14 + iVar7 * (uVar18 - 4)) {
          uVar18 = uVar18 - 4;
        }
        uVar15 = (uVar18 + 0x1ffc >> 2) * uVar22 + uVar14 & 0x7ff;
        *(uint *)((long)__dest + 0x158) =
             *(uint *)((long)__dest + 0x158) & 0xf8030000 | (uint)uVar11 | (uVar18 & 0x1f) << 0xb |
             uVar15;
        if (((byte)hal_h265e_debug & 8) != 0) {
          _mpp_log_l(4,"hal_h265e_v580","cime_rama_h %d, cime_rama_max %d, cime_linebuf_w %d",
                     (char *)0x0,(ulong)(uVar18 & 0x1c),(ulong)uVar15,uVar22);
        }
        pMVar3 = *(MppDevRegOffCfgs **)(lVar2 + 0x218);
        uVar15 = *local_38;
        MVar4 = mpp_frame_get_fmt(enc_task->frame);
        RVar13 = (syn->pp).ver_stride;
        if (RVar13 == 0) {
          RVar13 = (syn->pp).pic_height;
        }
        if ((((ulong)enc_task->rc_task->frm & 8) == 0) && ((MVar4 & 0xf00000) != MPP_FMT_YUV420SP))
        {
          RVar5 = mpp_frame_get_fbc_offset(enc_task->frame);
LAB_0024665d:
          offset = 0;
        }
        else {
          RVar5 = (uint)RVar13 * (uint)(syn->pp).hor_stride;
          switch(uVar15) {
          case 0:
          case 1:
          case 2:
          case 8:
          case 9:
          case 10:
            RVar5 = 0;
            goto LAB_0024665d;
          default:
            _mpp_log_l(2,"hal_h265e_v580","unknown color space: %d\n","vepu580_h265_set_patch_info",
                       (ulong)uVar15);
          case 7:
            offset = RVar5 * 5 >> 2;
            break;
          case 4:
          case 6:
          case 0xc:
            offset = RVar5;
            break;
          case 5:
            offset = RVar5 * 3 >> 1;
            break;
          case 0xd:
            offset = RVar5 * 2;
          }
        }
        MVar6 = mpp_dev_multi_offset_update(pMVar3,0xa1,RVar5);
        if (MVar6 != MPP_OK) {
          _mpp_log_l(2,"hal_h265e_v580","set input cb addr offset failed %d\n",
                     "vepu580_h265_set_patch_info",(ulong)(uint)MVar6);
        }
        MVar6 = mpp_dev_multi_offset_update(pMVar3,0xa2,offset);
        if (MVar6 != MPP_OK) {
          _mpp_log_l(2,"hal_h265e_v580","set input cr addr offset failed %d\n",
                     "vepu580_h265_set_patch_info",(ulong)(uint)MVar6);
        }
        if (1 < (uint)local_48) {
          hal_h265e_v580_set_uniform_tile(regs,syn,(RK_U32)uVar21,tile_start_x);
        }
        if (uVar21 != 0) {
          iVar7 = mpp_buffer_get_fd_with_caller
                            (*(MppBuffer *)(lVar2 + 400 + uVar21 * 8),"hal_h265e_v580_start");
          *(int *)((long)__dest + 0xa0) = iVar7;
          iVar7 = mpp_buffer_get_fd_with_caller
                            (*(MppBuffer *)(lVar2 + 0x188 + uVar21 * 8),"hal_h265e_v580_start");
          *(int *)((long)__dest + 0xa4) = iVar7;
          if (*(int *)((long)hal + 0xec) == 0) {
            sVar9 = mpp_packet_get_length(enc_task->packet);
            RVar5 = (int)sVar9 + local_9c;
            iVar7 = mpp_buffer_get_fd_with_caller(enc_task->output,"hal_h265e_v580_start");
            lVar12 = 0x94;
            ppvVar20 = local_60;
          }
          else {
            ppvVar20 = (MppBuffer *)(local_58 + (uVar21 - 1) * 8);
            iVar7 = mpp_buffer_get_fd_with_caller(*ppvVar20,"hal_h265e_v580_start");
            *(int *)((long)__dest + 0x90) = iVar7;
            *(int *)((long)__dest + 0x94) = iVar7;
            *(int *)((long)__dest + 0x98) = iVar7;
            RVar5 = 0;
            lVar12 = 0x9c;
          }
          *(int *)((long)__dest + lVar12) = iVar7;
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar2 + 0x218),0xaf,RVar5);
          pMVar3 = *(MppDevRegOffCfgs **)(lVar2 + 0x218);
          sVar9 = mpp_buffer_get_size_with_caller(*ppvVar20,"hal_h265e_v580_start");
          mpp_dev_multi_offset_update(pMVar3,0xac,(RK_U32)sVar9);
          RVar5 = *(RK_U32 *)((long)hal + 0x138);
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar2 + 0x218),0xa6,RVar5);
          mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar2 + 0x218),0xa4,RVar5);
        }
        if (((ulong)enc_task->rc_task->frm & 4) != 0) {
          RVar5 = (syn->pp).field_22.CodingSettingPicturePropertyFlags;
          lVar12 = *(long *)((long)hal + 0x80);
          uVar15 = *(int *)(*(long *)((long)hal + 200) + 0xc) + 0x3fU & 0xffffffc0;
          uVar22 = *(int *)(*(long *)((long)hal + 200) + 0x10) + 0xfU & 0xfffffff0;
          if ((*(long *)((long)hal + 0xf8) == 0) &&
             (iVar7 = uVar22 * uVar15,
             mpp_buffer_get_with_tag
                       ((MppBufferGroup)0x0,buffer,(long)((iVar7 >> 1) + iVar7),"hal_h265e_v580",
                        "vepu580_h265e_save_pass1_patch"), *buffer == (MppBuffer)0x0)) {
            _mpp_log_l(2,"hal_h265e_v580","buf_pass1 malloc fail, debreath invaild",(char *)0x0);
          }
          else {
            *(byte *)((long)__dest + 0xe0) = *(byte *)((long)__dest + 0xe0) | 4;
            iVar7 = mpp_buffer_get_fd_with_caller(*buffer,"vepu580_h265e_save_pass1_patch");
            *(int *)((long)__dest + 0x6c) = iVar7;
            *(int *)((long)__dest + 0x70) = iVar7;
            *(byte *)((long)__dest + 0xe3) = *(byte *)((long)__dest + 0xe3) | 0x80;
            if ((char)RVar5 < '\0') {
              *(byte *)((long)__dest + 0x19a) = *(byte *)((long)__dest + 0x19a) & 0xdf;
            }
            mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar12 + 0x218),0xa4,uVar22 * uVar15)
            ;
            *(byte *)((long)__dest + 0x140) = *(byte *)((long)__dest + 0x140) & 0xfe;
            *(byte *)((long)__dest + 0xe3) = *(byte *)((long)__dest + 0xe3) & 0xbf;
          }
        }
        if (((ulong)enc_task->rc_task->frm & 8) != 0) {
          lVar12 = *(long *)((long)hal + 0x80);
          uVar1 = *(undefined8 *)(*(long *)((long)hal + 200) + 0xc);
          uVar15 = (int)uVar1 + 0x3f;
          RVar5 = ((int)((ulong)uVar1 >> 0x20) + 0xfU & 0xfffffff0) * (uVar15 & 0xffffffc0);
          *(uint *)((long)__dest + 0x30) =
               *(uint *)((long)__dest + 0x30) & 0xffffff0f |
               (*(uint *)(*(long *)((long)hal + 0x110) + 0x10) & 0xf) << 4;
          *(uint *)((long)__dest + 0xf8) = *(uint *)((long)__dest + 0xf8) & 0xffffff40 | 0x98;
          *(uint *)((long)__dest + 0x114) =
               uVar15 & 0x1ffc0 | *(uint *)((long)__dest + 0x114) & 0xfffe0000;
          *(uint *)((long)__dest + 0x118) =
               uVar15 & 0xffc0 | *(uint *)((long)__dest + 0x118) & 0xffff0000;
          *(ulong *)((long)__dest + 0x10c) = *(ulong *)((long)__dest + 0x10c) & 0xc000c000a3ffffff;
          iVar7 = mpp_buffer_get_fd_with_caller
                            (*(MppBuffer *)((long)hal + 0xf8),"vepu580_h265e_use_pass1_patch");
          *(int *)((long)__dest + 0x60) = iVar7;
          *(int *)((long)__dest + 100) = iVar7;
          *(int *)((long)__dest + 0x68) = iVar7;
          MVar6 = mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar12 + 0x218),0xa1,RVar5);
          if (MVar6 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","set input cb addr offset failed %d\n",
                       "vepu580_h265e_use_pass1_patch",(ulong)(uint)MVar6);
          }
          MVar6 = mpp_dev_multi_offset_update(*(MppDevRegOffCfgs **)(lVar12 + 0x218),0xa2,RVar5);
          if (MVar6 != MPP_OK) {
            _mpp_log_l(2,"hal_h265e_v580","set input cr addr offset failed %d\n",
                       "vepu580_h265e_use_pass1_patch",(ulong)(uint)MVar6);
          }
        }
        ctx = *(MppDev *)((long)hal + 0x68);
        cfg.size = 0x60;
        cfg.offset = 0;
        cfg.reg = __dest;
        MVar6 = mpp_dev_ioctl(ctx,4,&cfg);
        if (MVar6 == MPP_OK) {
          if (((byte)hal_h265e_debug & 0x20) != 0) {
            for (uVar11 = 0; uVar11 != 0x60; uVar11 = uVar11 + 4) {
              if (((byte)hal_h265e_debug & 0x20) != 0) {
                _mpp_log_l(4,"hal_h265e_v580","ctl reg[%04x]: 0%08x\n",(char *)0x0,
                           uVar11 & 0xffffffff,(ulong)*(uint *)((long)__dest + uVar11));
              }
            }
          }
          cfg.size = 0x178;
          cfg.offset = 0x280;
          cfg.reg = regs;
          MVar6 = mpp_dev_ioctl(ctx,4,&cfg);
          if (MVar6 == MPP_OK) {
            if (((byte)hal_h265e_debug & 0x10) != 0) {
              for (uVar11 = 0; uVar11 != 0x80; uVar11 = uVar11 + 4) {
                if (((byte)hal_h265e_debug & 0x10) != 0) {
                  _mpp_log_l(4,"hal_h265e_v580","hw add cfg reg[%04x]: 0%08x\n",(char *)0x0,
                             uVar11 & 0xffffffff,
                             (ulong)*(uint *)((long)regs->reserved184_191 + (uVar11 - 0x60)));
                }
              }
              for (uVar11 = 0; uVar11 != 0xf8; uVar11 = uVar11 + 4) {
                if (((byte)hal_h265e_debug & 0x10) != 0) {
                  _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                             uVar11 & 0xffffffff,(ulong)*(uint *)((long)__dest + uVar11 + 0xe0));
                }
              }
            }
            cfg.size = 0xe4;
            cfg.offset = 0x1000;
            cfg.reg = (void *)((long)__dest + 0x1d8);
            MVar6 = mpp_dev_ioctl(ctx,4,&cfg);
            if (((byte)hal_h265e_debug & 0x40) != 0) {
              for (uVar11 = 0; uVar11 != 0xe4; uVar11 = uVar11 + 4) {
                if (((byte)hal_h265e_debug & 0x40) != 0) {
                  _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                             uVar11 & 0xffffffff,(ulong)*(uint *)((long)__dest + 0x1d8 + uVar11));
                }
              }
            }
            if (MVar6 == MPP_OK) {
              cfg.size = 0x5d8;
              cfg.offset = 0x1700;
              cfg.reg = (void *)((long)__dest + 700);
              MVar6 = mpp_dev_ioctl(ctx,4,&cfg);
              if (MVar6 == MPP_OK) {
                if (((byte)hal_h265e_debug & 0x80) != 0) {
                  for (uVar11 = 0; uVar11 != 0x5d8; uVar11 = uVar11 + 4) {
                    if (((byte)hal_h265e_debug & 0x80) != 0) {
                      _mpp_log_l(4,"hal_h265e_v580","set reg[%04x]: 0%08x\n",(char *)0x0,
                                 uVar11 & 0xffffffff,(ulong)*(uint *)((long)__dest + 700 + uVar11));
                    }
                  }
                }
                cfg.reg = (void *)((long)__dest + 0x894);
                cfg.size = 0xc9c;
                cfg.offset = 0x2000;
                MVar6 = mpp_dev_ioctl(ctx,4,&cfg);
                if (MVar6 == MPP_OK) {
                  cfg.reg = (void *)((long)__dest + 0x1530);
                  cfg.size = 0x480;
                  cfg.offset = 0x3000;
                  MVar6 = mpp_dev_ioctl(ctx,4,&cfg);
                  if (MVar6 != MPP_OK) goto LAB_00246ab1;
                  local_68 = 0x2c00000004;
                  local_70 = pvVar8;
                  MVar6 = mpp_dev_ioctl(ctx,5,&local_70);
                  if (MVar6 == MPP_OK) {
                    local_70 = (void *)((long)pvVar8 + 4);
                    local_68 = 0x4000000002d0;
                    MVar6 = mpp_dev_ioctl(ctx,5,&local_70);
                    if (MVar6 == MPP_OK) goto LAB_00246d15;
                  }
                  fmt = "set register read failed %d\n";
                  goto LAB_00246abe;
                }
                _mpp_log_l(2,"hal_h265e_v580","set register write failed %d\n",
                           "hal_h265e_v580_send_regs",(ulong)(uint)MVar6);
              }
              else {
                _mpp_log_l(2,"hal_h265e_v580","set register write failed %d\n",
                           "hal_h265e_v580_send_regs",(ulong)(uint)MVar6);
              }
            }
            else {
              _mpp_log_l(2,"hal_h265e_v580","set rc kult  write failed %d\n",
                         "hal_h265e_v580_send_regs",(ulong)(uint)MVar6);
            }
          }
          else {
            _mpp_log_l(2,"hal_h265e_v580","set register write failed %d\n",
                       "hal_h265e_v580_send_regs",(ulong)(uint)MVar6);
          }
        }
        else {
LAB_00246ab1:
          fmt = "set register write failed %d\n";
LAB_00246abe:
          _mpp_log_l(2,"hal_h265e_v580",fmt,"hal_h265e_v580_send_regs",(ulong)(uint)MVar6);
        }
LAB_00246d15:
        mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),7,*(void **)(lVar2 + 0x218));
        if (uVar21 < local_50) {
          if (*(int *)((long)hal + 0xec) == 0) {
            MVar6 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0xf,(void *)0x0);
            if (MVar6 != MPP_OK) {
              _mpp_log_l(2,"hal_h265e_v580","send cmd failed %d\n","hal_h265e_v580_start",
                         (ulong)(uint)MVar6);
            }
            MVar6 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),0x10,(void *)0x0);
            if (MVar6 != MPP_OK) {
              _mpp_log_l(2,"hal_h265e_v580","poll cmd failed %d\n","hal_h265e_v580_start",
                         (ulong)(uint)MVar6);
            }
            iVar7 = *(int *)((long)pvVar8 + 4);
            *(int *)(lVar2 + 0x5c) = *(int *)(lVar2 + 0x5c) + *(int *)((long)pvVar8 + 0x10);
            *(int *)(lVar2 + 0x60) = *(int *)(lVar2 + 0x60) + iVar7;
            *(long *)(lVar2 + 0x68) =
                 *(long *)(lVar2 + 0x68) +
                 (ulong)(*(int *)((long)pvVar8 + 0xc) << 0x10 | *(uint *)((long)pvVar8 + 8) >> 0x10)
            ;
            *(int *)(lVar2 + 0x164) = *(int *)(lVar2 + 0x164) + *(int *)((long)pvVar8 + 300);
            *(int *)(lVar2 + 0x160) = *(int *)(lVar2 + 0x160) + *(int *)((long)pvVar8 + 0x124);
            local_9c = local_9c + iVar7;
            *(int *)(lVar2 + 0x188) =
                 *(int *)(lVar2 + 0x188) + (*(uint *)((long)pvVar8 + 0x130) & 0x7fffff);
            *(int *)(lVar2 + 0x18c) =
                 *(int *)(lVar2 + 0x18c) + (*(uint *)((long)pvVar8 + 0x128) & 0x1fffff);
          }
          else {
            mpp_dev_ioctl(*(MppDev *)((long)hal + 0x68),2,(void *)0x0);
          }
        }
        tile_start_x = tile_start_x + (syn->pp).column_width_minus1[uVar21] + 1;
        uVar21 = uVar21 + 1;
      } while( true );
    }
    _mpp_log_l(4,"hal_h265e_v580","tile_num big then support %d, max %d",(char *)0x0,(ulong)uVar15,4
              );
  }
  else {
    _mpp_log_l(2,"hal_h265e_v580","enc_task->flags.err %08x, return e arly","hal_h265e_v580_start");
  }
  return MPP_NOK;
}

Assistant:

MPP_RET hal_h265e_v580_start(void *hal, HalEncTask *enc_task)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    H265eSyntax_new *syn = ctx->syn;
    RK_U32 tile_num = (syn->pp.num_tile_columns_minus1 + 1) * (syn->pp.num_tile_rows_minus1 + 1);
    RK_U32 stream_len = 0;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    Vepu580H265eFrmCfg *frm = ctx->frm;
    RK_U32 k = 0;
    MPP_RET ret = MPP_OK;
    RK_S32 tile_start_x = 0;

    hal_h265e_enter();

    ctx->tile_num = tile_num;

    if (enc_task->flags.err) {
        hal_h265e_err("enc_task->flags.err %08x, return e arly",
                      enc_task->flags.err);
        return MPP_NOK;
    }

    if (tile_num > MAX_TILE_NUM) {
        mpp_log("tile_num big then support %d, max %d", tile_num, MAX_TILE_NUM);
        return MPP_NOK;
    }

    for (k = 0; k < tile_num; k++) {
        H265eV580RegSet *hw_regs = frm->regs_set[k];
        hevc_vepu580_base *reg_base = NULL;
        H265eV580StatusElem *reg_out = frm->regs_ret[k];

        if (!hw_regs) {
            hw_regs = mpp_malloc(H265eV580RegSet, 1);
            frm->regs_set[k] = hw_regs;
        }
        if (!reg_out) {
            reg_out = mpp_malloc(H265eV580StatusElem, 1);
            frm->regs_ret[k] = reg_out;
        }

        reg_base = &hw_regs->reg_base;

        if (k)
            memcpy(hw_regs, frm->regs_set[0], sizeof(*hw_regs));

        vepu580_h265_set_me_ram(syn, reg_base, k, tile_start_x);

        /* set input info */
        vepu580_h265_set_patch_info(frm->reg_cfg, syn, (Vepu541Fmt)fmt->format, enc_task);
        if (tile_num > 1)
            hal_h265e_v580_set_uniform_tile(reg_base, syn, k, tile_start_x);

        if (k) {
            RK_U32 offset = 0;

            reg_base->reg0176_lpfw_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[k]);
            reg_base->reg0177_lpfr_addr  = mpp_buffer_get_fd(frm->hw_tile_buf[k - 1]);

            if (!ctx->tile_parall_en) {
                offset = mpp_packet_get_length(enc_task->packet);
                offset += stream_len;

                reg_base->reg0173_bsbb_addr = mpp_buffer_get_fd(enc_task->output);

                mpp_dev_multi_offset_update(frm->reg_cfg, 175, offset);
                mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(enc_task->output));
            } else {
                reg_base->reg0172_bsbt_addr = mpp_buffer_get_fd(frm->hw_tile_stream[k - 1]);
                /* TODO: stream size relative with syntax */
                reg_base->reg0173_bsbb_addr = reg_base->reg0172_bsbt_addr;
                reg_base->reg0174_bsbr_addr = reg_base->reg0172_bsbt_addr;
                reg_base->reg0175_adr_bsbs  = reg_base->reg0172_bsbt_addr;

                mpp_dev_multi_offset_update(frm->reg_cfg, 175, 0);
                mpp_dev_multi_offset_update(frm->reg_cfg, 172, mpp_buffer_get_size(frm->hw_tile_stream[k - 1]));
            }

            offset = ctx->fbc_header_len;

            mpp_dev_multi_offset_update(frm->reg_cfg, 166, offset);
            mpp_dev_multi_offset_update(frm->reg_cfg, 164, offset);
        }

        if (enc_task->rc_task->frm.save_pass1)
            vepu580_h265e_save_pass1_patch(hw_regs, ctx, syn->pp.tiles_enabled_flag);

        if (enc_task->rc_task->frm.use_pass1)
            vepu580_h265e_use_pass1_patch(hw_regs, ctx);

        hal_h265e_v580_send_regs(ctx->dev, hw_regs, reg_out);

        mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_OFFS, frm->reg_cfg);

        if (k < tile_num - 1) {
            if (!ctx->tile_parall_en) {
                Vepu580H265Fbk *fb = &frm->feedback;

                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
                if (ret) {
                    mpp_err_f("send cmd failed %d\n", ret);
                }

                ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
                if (ret) {
                    mpp_err_f("poll cmd failed %d\n", ret);
                    ret = MPP_ERR_VPUHW;
                }
                stream_len += reg_out->st.bs_lgth_l32;
                fb->qp_sum += reg_out->st.qp_sum;
                fb->out_strm_size += reg_out->st.bs_lgth_l32;
                fb->sse_sum += (RK_S64)(reg_out->st.sse_h32 << 16) +
                               (reg_out->st.st_sse_bsl.sse_l16 & 0xffff);
                fb->st_madi += reg_out->st.madi;
                fb->st_madp += reg_out->st.madp;
                fb->st_mb_num += reg_out->st.st_bnum_b16.num_b16;
                fb->st_ctu_num += reg_out->st.st_bnum_cme.num_ctu;
            } else
                mpp_dev_ioctl(ctx->dev, MPP_DEV_DELIMIT, NULL);
        }
        tile_start_x += (syn->pp.column_width_minus1[k] + 1);
    }

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
    if (ret) {
        mpp_err_f("send cmd failed %d\n", ret);
    }
    hal_h265e_leave();
    return ret;
}